

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableBeginRow(ImGuiTable *table)

{
  long in_RDI;
  ImU32 unaff_retaddr;
  ImGuiTableBgTarget unaff_retaddr_00;
  float next_y1;
  ImGuiWindow *window;
  ImVec2 local_1c;
  undefined4 local_14;
  long lVar1;
  
  lVar1 = *(long *)(in_RDI + 0x188);
  *(int *)(in_RDI + 0x78) = *(int *)(in_RDI + 0x78) + 1;
  *(undefined4 *)(in_RDI + 0x7c) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0xa4) = 0x1000000;
  *(undefined4 *)(in_RDI + 0xa0) = 0x1000000;
  *(undefined1 *)(in_RDI + 0x205) = 0xff;
  *(undefined1 *)(in_RDI + 0x20a) = 1;
  local_14 = *(undefined4 *)(in_RDI + 0x88);
  if ((*(int *)(in_RDI + 0x78) == 0) && ('\0' < *(char *)(in_RDI + 0x202))) {
    local_14 = *(undefined4 *)(in_RDI + 0xf4);
    *(undefined4 *)(lVar1 + 0xe4) = local_14;
  }
  *(undefined4 *)(in_RDI + 0x88) = local_14;
  *(undefined4 *)(in_RDI + 0x84) = local_14;
  *(undefined4 *)(in_RDI + 0x90) = 0;
  *(float *)(in_RDI + 0x94) = *(float *)(lVar1 + 0x124) - *(float *)(in_RDI + 0xb8);
  *(undefined4 *)(lVar1 + 0x11c) = 0;
  ImVec2::ImVec2(&local_1c,0.0,0.0);
  *(ImVec2 *)(lVar1 + 0x108) = local_1c;
  *(undefined1 *)(lVar1 + 0x121) = 0;
  *(undefined1 *)(lVar1 + 0x120) = 0;
  *(undefined4 *)(lVar1 + 0xfc) = local_14;
  if ((*(uint *)(in_RDI + 0x98) & 1) != 0) {
    GetColorU32((ImGuiCol)((ulong)lVar1 >> 0x20),(float)lVar1);
    TableSetBgColor(unaff_retaddr_00,unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
    if (*(int *)(in_RDI + 0x78) == 0) {
      *(undefined1 *)(in_RDI + 0x20d) = 1;
    }
  }
  return;
}

Assistant:

void ImGui::TableBeginRow(ImGuiTable* table)
{
    ImGuiWindow* window = table->InnerWindow;
    IM_ASSERT(!table->IsInsideRow);

    // New row
    table->CurrentRow++;
    table->CurrentColumn = -1;
    table->RowBgColor[0] = table->RowBgColor[1] = IM_COL32_DISABLE;
    table->RowCellDataCurrent = -1;
    table->IsInsideRow = true;

    // Begin frozen rows
    float next_y1 = table->RowPosY2;
    if (table->CurrentRow == 0 && table->FreezeRowsCount > 0)
        next_y1 = window->DC.CursorPos.y = table->OuterRect.Min.y;

    table->RowPosY1 = table->RowPosY2 = next_y1;
    table->RowTextBaseline = 0.0f;
    table->RowIndentOffsetX = window->DC.Indent.x - table->HostIndentX; // Lock indent
    window->DC.PrevLineTextBaseOffset = 0.0f;
    window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);
    window->DC.IsSameLine = window->DC.IsSetPos = false;
    window->DC.CursorMaxPos.y = next_y1;

    // Making the header BG color non-transparent will allow us to overlay it multiple times when handling smooth dragging.
    if (table->RowFlags & ImGuiTableRowFlags_Headers)
    {
        TableSetBgColor(ImGuiTableBgTarget_RowBg0, GetColorU32(ImGuiCol_TableHeaderBg));
        if (table->CurrentRow == 0)
            table->IsUsingHeaders = true;
    }
}